

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O1

void __thiscall ftxui::MenuBase::~MenuBase(MenuBase *this)

{
  pointer pBVar1;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__MenuBase_00175428;
  pBVar1 = (this->boxes_).super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pBVar1 != (pointer)0x0) {
    operator_delete(pBVar1,(long)(this->boxes_).
                                 super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pBVar1);
  }
  MenuOption::~MenuOption(&(this->option_).owned_);
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  operator_delete(this,0x130);
  return;
}

Assistant:

MenuBase(ConstStringListRef entries, int* selected, Ref<MenuOption> option)
      : entries_(entries), selected_(selected), option_(option) {}